

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprSetHeight(Expr *p)

{
  int iVar1;
  int iVar2;
  Select *pSelect;
  long lVar3;
  uint uVar4;
  long lVar5;
  int local_c;
  
  if (p->pLeft == (Expr *)0x0) {
    local_c = 0;
  }
  else {
    local_c = p->pLeft->nHeight;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_c < iVar1)) {
    local_c = iVar1;
  }
  pSelect = (Select *)(p->x).pList;
  if ((p->flags >> 0xc & 1) == 0) {
    if (pSelect != (Select *)0x0) {
      iVar1._0_1_ = pSelect->op;
      iVar1._1_1_ = pSelect->field_0x1;
      iVar1._2_2_ = pSelect->nSelectRow;
      if (0 < (long)iVar1) {
        lVar5 = 0;
        do {
          lVar3 = *(long *)((long)pSelect->addrOpenEphm + lVar5 + -0xc);
          if ((lVar3 != 0) && (iVar2 = *(int *)(lVar3 + 0x28), local_c < iVar2)) {
            local_c = iVar2;
          }
          lVar5 = lVar5 + 0x18;
        } while ((long)iVar1 * 0x18 != lVar5);
      }
      iVar2._0_1_ = pSelect->op;
      iVar2._1_1_ = pSelect->field_0x1;
      iVar2._2_2_ = pSelect->nSelectRow;
      if ((long)iVar2 < 1) {
        uVar4 = 0;
      }
      else {
        lVar5 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 | *(uint *)(*(long *)((long)pSelect->addrOpenEphm + lVar5 + -0xc) + 4);
          lVar5 = lVar5 + 0x18;
        } while ((long)iVar2 * 0x18 != lVar5);
        uVar4 = uVar4 & 0x400208;
      }
      p->flags = uVar4 | p->flags;
    }
  }
  else {
    heightOfSelect(pSelect,&local_c);
  }
  p->nHeight = local_c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = p->pLeft ? p->pLeft->nHeight : 0;
  if( p->pRight && p->pRight->nHeight>nHeight ) nHeight = p->pRight->nHeight;
  if( ExprUseXSelect(p) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}